

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O0

int dorub(obj *obj)

{
  boolean bVar1;
  int iVar2;
  obj *local_18;
  obj *obj_local;
  
  if ((obj == (obj *)0x0) || (bVar1 = validate_object(obj,"\x06\r","rub"), bVar1 != '\0')) {
    local_18 = obj;
    if (obj == (obj *)0x0) {
      local_18 = getobj("\x06\r","rub",(obj **)0x0);
    }
    if (local_18 == (obj *)0x0) {
      obj_local._4_4_ = 0;
    }
    else if (local_18->oclass == '\r') {
      if ((((local_18->otyp == 0x20f) || (local_18->otyp == 0x210)) || (local_18->otyp == 0x212)) ||
         (local_18->otyp == 0x211)) {
        obj_local._4_4_ = use_stone(local_18);
      }
      else {
        pline("Sorry, I don\'t know how to use that.");
        obj_local._4_4_ = 0;
      }
    }
    else {
      if (local_18->otyp == 0xe9) {
        bVar1 = wield_tool(local_18,"rub");
        if (bVar1 == '\0') {
          return 0;
        }
        if ((uwep->spe < '\x01') || (iVar2 = rn2(3), iVar2 != 0)) {
          iVar2 = rn2(2);
          if ((iVar2 == 0) ||
             ((((u.uprops[0x1e].intrinsic != 0 ||
                ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
               (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
              ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))))) {
            pline("Nothing happens.");
          }
          else {
            pline("You see a puff of smoke.");
          }
        }
        else {
          check_unpaid_usage(uwep,'\x01');
          djinni_from_bottle(uwep);
          discover_object(0xe9,'\x01','\x01');
          uwep->otyp = 0xe8;
          uwep->spe = '\0';
          iVar2 = rn2(500);
          uwep->age = iVar2 + 1000;
          if ((*(uint *)&uwep->field_0x4a >> 0x13 & 1) != 0) {
            begin_burn(level,uwep,'\x01');
          }
          update_inventory();
        }
      }
      else if (local_18->otyp == 0xe7) {
        bVar1 = wield_tool(local_18,"rub");
        if (bVar1 == '\0') {
          return 0;
        }
        pline("Rubbing the electric lamp is not particularly rewarding.");
        pline("Anyway, nothing exciting happens.");
      }
      else if (local_18->otyp == 0xe8) {
        bVar1 = wield_tool(local_18,"rub");
        if (bVar1 == '\0') {
          return 0;
        }
        pline("Nothing happens.");
      }
      else {
        pline("Nothing happens.");
      }
      obj_local._4_4_ = 1;
    }
  }
  else {
    obj_local._4_4_ = 0;
  }
  return obj_local._4_4_;
}

Assistant:

int dorub(struct obj *obj)
{
	if (obj && !validate_object(obj, cuddly, "rub"))
	    return 0;
	else if (!obj)
	    obj = getobj(cuddly, "rub", NULL);

        if (!obj) return 0;

	if (obj->oclass == GEM_CLASS) {
	    if (is_graystone(obj)) {
		return use_stone(obj);
	    } else {
		pline("Sorry, I don't know how to use that.");
		return 0;
	    }
	}

	if (obj->otyp == MAGIC_LAMP) {
            if (!wield_tool(obj, "rub")) return 0;
	    if (uwep->spe > 0 && !rn2(3)) {
		check_unpaid_usage(uwep, TRUE);		/* unusual item use */
		djinni_from_bottle(uwep);
		makeknown(MAGIC_LAMP);
		uwep->otyp = OIL_LAMP;
		uwep->spe = 0; /* for safety */
		uwep->age = rn1(500,1000);
		if (uwep->lamplit) begin_burn(level, uwep, TRUE);
		update_inventory();
	    } else if (rn2(2) && !Blind)
		pline("You see a puff of smoke.");
	    else pline("Nothing happens.");
	} else if (obj->otyp == BRASS_LANTERN) {
            if (!wield_tool(obj, "rub")) return 0;
	    /* message from Adventure */
	    pline("Rubbing the electric lamp is not particularly rewarding.");
	    pline("Anyway, nothing exciting happens.");
        } else if (obj->otyp == OIL_LAMP) {
            if (!wield_tool(obj,"rub")) return 0;
            pline("Nothing happens.");
	} else pline("Nothing happens.");
	return 1;
}